

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<EnumNameValue>::emplace<EnumNameValue_const&>
          (QGenericArrayOps<EnumNameValue> *this,qsizetype i,EnumNameValue *args)

{
  qsizetype *pqVar1;
  EnumNameValue **ppEVar2;
  Data *pDVar3;
  long lVar4;
  EnumNameValue *pEVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  long in_FS_OFFSET;
  bool bVar12;
  EnumNameValue tmp;
  Inserter local_b8;
  EnumNameValue local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<EnumNameValue>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0010ce06:
    local_68.name.d.d = (args->name).d.d;
    local_68.name.d.ptr = (args->name).d.ptr;
    local_68.name.d.size = (args->name).d.size;
    if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_68.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68.valueStr.d.d = (args->valueStr).d.d;
    local_68.valueStr.d.ptr = (args->valueStr).d.ptr;
    local_68.valueStr.d.size = (args->valueStr).d.size;
    if (&(local_68.valueStr.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.valueStr.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_68.valueStr.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68._52_4_ = 0xaaaaaaaa;
    local_68.value = args->value;
    bVar12 = (this->super_QArrayDataPointer<EnumNameValue>).size != 0;
    QArrayDataPointer<EnumNameValue>::detachAndGrow
              (&this->super_QArrayDataPointer<EnumNameValue>,(uint)(i == 0 && bVar12),1,
               (EnumNameValue **)0x0,(QArrayDataPointer<EnumNameValue> *)0x0);
    qVar11 = local_68.valueStr.d.size;
    pcVar10 = local_68.valueStr.d.ptr;
    pDVar9 = local_68.valueStr.d.d;
    qVar8 = local_68.name.d.size;
    pcVar7 = local_68.name.d.ptr;
    pDVar6 = local_68.name.d.d;
    if (i == 0 && bVar12) {
      pEVar5 = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
      local_68.name.d.d = (Data *)0x0;
      pEVar5[-1].name.d.d = pDVar6;
      local_68.name.d.ptr = (char16_t *)0x0;
      pEVar5[-1].name.d.ptr = pcVar7;
      local_68.name.d.size = 0;
      pEVar5[-1].name.d.size = qVar8;
      local_68.valueStr.d.d = (Data *)0x0;
      pEVar5[-1].valueStr.d.d = pDVar9;
      local_68.valueStr.d.ptr = (char16_t *)0x0;
      pEVar5[-1].valueStr.d.ptr = pcVar10;
      local_68.valueStr.d.size = 0;
      pEVar5[-1].valueStr.d.size = qVar11;
      pEVar5[-1].value = local_68.value;
      (this->super_QArrayDataPointer<EnumNameValue>).ptr = pEVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<EnumNameValue>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_b8.sourceCopyConstruct = 0;
      local_b8.nSource = 0;
      local_b8.move = 0;
      local_b8.sourceCopyAssign = 0;
      local_b8.end = (EnumNameValue *)0x0;
      local_b8.last = (EnumNameValue *)0x0;
      local_b8.where = (EnumNameValue *)0x0;
      local_b8.begin = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
      local_b8.size = (this->super_QArrayDataPointer<EnumNameValue>).size;
      local_b8.data = &this->super_QArrayDataPointer<EnumNameValue>;
      Inserter::insertOne(&local_b8,i,&local_68);
      (local_b8.data)->ptr = local_b8.begin;
      (local_b8.data)->size = local_b8.size;
    }
    if (&(local_68.valueStr.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.valueStr.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.valueStr.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.valueStr.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.valueStr.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_68.name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<EnumNameValue>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<EnumNameValue>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x6db6db6db6db6db7)) {
      pEVar5 = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
      pDVar6 = (args->name).d.d;
      pEVar5[lVar4].name.d.d = pDVar6;
      pEVar5[lVar4].name.d.ptr = (args->name).d.ptr;
      pEVar5[lVar4].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar6 = (args->valueStr).d.d;
      pEVar5[lVar4].valueStr.d.d = pDVar6;
      pEVar5[lVar4].valueStr.d.ptr = (args->valueStr).d.ptr;
      pEVar5[lVar4].valueStr.d.size = (args->valueStr).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pEVar5[lVar4].value = args->value;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((EnumNameValue *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<EnumNameValue>).ptr)) goto LAB_0010ce06;
      pEVar5 = (this->super_QArrayDataPointer<EnumNameValue>).ptr;
      pDVar6 = (args->name).d.d;
      pEVar5[-1].name.d.d = pDVar6;
      pEVar5[-1].name.d.ptr = (args->name).d.ptr;
      pEVar5[-1].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar6 = (args->valueStr).d.d;
      pEVar5[-1].valueStr.d.d = pDVar6;
      pEVar5[-1].valueStr.d.ptr = (args->valueStr).d.ptr;
      pEVar5[-1].valueStr.d.size = (args->valueStr).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pEVar5[-1].value = args->value;
      ppEVar2 = &(this->super_QArrayDataPointer<EnumNameValue>).ptr;
      *ppEVar2 = *ppEVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<EnumNameValue>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }